

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O3

void __thiscall GOESNImageHandler::handle(GOESNImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  GOESNImageHandler *pGVar3;
  GOESNImageHandler *pGVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  File *f_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  _Base_ptr p_Var9;
  mapped_type *this_01;
  _Base_ptr p_Var10;
  long lVar11;
  GOESNImageHandler *pGVar12;
  value_type *t;
  pointer psVar13;
  long lVar14;
  pointer psVar15;
  const_iterator __position;
  iterator end;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  string text;
  Timer t_1;
  NOAALRITHeader nlh;
  Details db;
  string filename;
  string path;
  Channel channel;
  Region region;
  Details details;
  SegmentIdentificationHeader sih;
  Details da;
  tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key;
  PrimaryHeader ph;
  undefined1 local_518 [8];
  value_type local_510;
  pointer local_500;
  undefined1 local_4f8 [40];
  NOAALRITHeader local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  Details local_4a0 [2];
  string local_440;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  local_420;
  undefined1 local_408 [96];
  Channel local_3a8;
  Region local_368;
  undefined1 local_328 [54];
  SegmentIdentificationHeader local_2f2;
  undefined1 local_2e0 [24];
  undefined1 local_2c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  undefined8 local_2a0;
  pointer pMStack_298;
  _Alloc_hider local_290;
  pointer local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  pointer local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  _Base_ptr local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  _Base_ptr local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  pointer local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  _Invoker_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  __node_base local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Tuple_impl<0UL,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  PrimaryHeader local_48;
  
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lrit::getHeader<lrit::PrimaryHeader>(&local_48,&peVar2->header_,&peVar2->m_);
  if (local_48.fileType != '\0') {
    return;
  }
  peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pGVar12 = (GOESNImageHandler *)&peVar2->m_;
  local_4d0 = lrit::getHeader<lrit::NOAALRITHeader>(&peVar2->header_,(HeaderMap *)pGVar12);
  if (this->productID_ != local_4d0.productID) {
    return;
  }
  loadRegion(&local_368,pGVar12,&local_4d0);
  pGVar3 = (GOESNImageHandler *)
           (this->config_).regions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar4 = (GOESNImageHandler *)
           (this->config_).regions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pGVar3 != pGVar4) &&
     (pGVar12 = pGVar4,
     _Var8 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pGVar3,pGVar4,&local_368), (GOESNImageHandler *)_Var8._M_current == pGVar4))
  goto LAB_0017afb6;
  loadChannel(&local_3a8,pGVar12,&local_4d0);
  pbVar5 = (this->config_).channels.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (this->config_).channels.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar5 == pbVar6) ||
     (_Var8 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (pbVar5,pbVar6,&local_3a8), _Var8._M_current != pbVar6)) {
    peVar2 = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var9 = *(_Base_ptr *)((long)&(peVar2->m_)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
    if (p_Var9 != (_Base_ptr)0x0) {
      p_Var1 = &(peVar2->m_)._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = &p_Var1->_M_header;
      do {
        if (0x7f < (int)p_Var9[1]._M_color) {
          p_Var10 = p_Var9;
        }
        p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < 0x80];
      } while (p_Var9 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var10 != p_Var1) && ((int)p_Var10[1]._M_color < 0x81)) {
        lrit::getHeader<lrit::SegmentIdentificationHeader>(&local_2f2,&peVar2->header_,&peVar2->m_);
        std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
        _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
                  ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)&local_90,
                   &local_368.nameShort,&local_3a8.nameShort);
        local_90.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "unused";
        std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
        _Tuple_impl<char_const*,std::__cxx11::string,std::__cxx11::string>
                  ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                    *)local_2e0,&local_90);
        pGVar12 = (GOESNImageHandler *)local_2e0;
        this_01 = std::__detail::
                  _Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->segments_,(key_type *)pGVar12);
        if ((_Alloc_hider *)local_2a0 != &local_290) {
          pGVar12 = (GOESNImageHandler *)(local_290._M_p + 1);
          operator_delete((void *)local_2a0,(ulong)pGVar12);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)aStack_2c0._0_8_ != &local_2b0) {
          pGVar12 = (GOESNImageHandler *)
                    (CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1);
          operator_delete((void *)aStack_2c0._0_8_,(ulong)pGVar12);
        }
        if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
          pGVar12 = (GOESNImageHandler *)(CONCAT71(local_2e0._17_7_,local_2e0[0x10]) + 1);
          operator_delete((void *)local_2e0._0_8_,(ulong)pGVar12);
        }
        psVar15 = (this_01->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (psVar15 !=
            (this_01->
            super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          loadDetails((Details *)local_2e0,pGVar12,
                      (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
          loadDetails(local_4a0,pGVar12,
                      (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
          if ((_func_int **)local_2e0._0_8_ !=
              (_func_int **)
              CONCAT26(local_4a0[0].frameStart.tv_sec._6_2_,
                       (undefined6)local_4a0[0].frameStart.tv_sec)) {
            std::
            vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
            ::clear(this_01);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a0[0].satellite._M_dataplus._M_p != &local_4a0[0].satellite.field_2) {
            operator_delete(local_4a0[0].satellite._M_dataplus._M_p,
                            local_4a0[0].satellite.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)CONCAT71(local_2e0._17_7_,local_2e0[0x10]) != local_2c8 + 8) {
            operator_delete((undefined1 *)CONCAT71(local_2e0._17_7_,local_2e0[0x10]),
                            aStack_2c0._0_8_ + 1);
          }
        }
        local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
        if (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        lrit::getHeader<lrit::SegmentIdentificationHeader>
                  ((SegmentIdentificationHeader *)local_4a0,
                   &(local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->header_,
                   &(local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_);
        psVar15 = (this_01->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar13 = (this_01->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        lVar11 = (long)psVar13 - (long)psVar15;
        if (0 < lVar11 >> 6) {
          lVar14 = (lVar11 >> 6) + 1;
          psVar15 = psVar15 + 2;
          local_500 = psVar13;
          do {
            __position._M_current = psVar15;
            peVar2 = __position._M_current[-2].
                     super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            lrit::getHeader<lrit::SegmentIdentificationHeader>
                      ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
            if (local_4a0[0].frameStart.tv_sec._6_2_ < (ushort)local_2e0._6_2_) {
              __position._M_current = __position._M_current + -2;
              goto LAB_0017aa73;
            }
            peVar2 = __position._M_current[-1].
                     super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            lrit::getHeader<lrit::SegmentIdentificationHeader>
                      ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
            if (local_4a0[0].frameStart.tv_sec._6_2_ < (ushort)local_2e0._6_2_) {
              __position._M_current = __position._M_current + -1;
              goto LAB_0017aa73;
            }
            peVar2 = ((__position._M_current)->
                     super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            lrit::getHeader<lrit::SegmentIdentificationHeader>
                      ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
            if (local_4a0[0].frameStart.tv_sec._6_2_ < (ushort)local_2e0._6_2_) goto LAB_0017aa73;
            peVar2 = __position._M_current[1].
                     super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            lrit::getHeader<lrit::SegmentIdentificationHeader>
                      ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
            if (local_4a0[0].frameStart.tv_sec._6_2_ < (ushort)local_2e0._6_2_) {
              __position._M_current = __position._M_current + 1;
              goto LAB_0017aa73;
            }
            lVar14 = lVar14 + -1;
            lVar11 = lVar11 + -0x40;
            psVar15 = __position._M_current + 4;
          } while (1 < lVar14);
          psVar15 = __position._M_current + 2;
          psVar13 = local_500;
        }
        lVar11 = lVar11 >> 4;
        if (lVar11 == 1) {
LAB_0017aa33:
          peVar2 = (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          lrit::getHeader<lrit::SegmentIdentificationHeader>
                    ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
          __position._M_current = psVar15;
          if ((ushort)local_2e0._6_2_ <= local_4a0[0].frameStart.tv_sec._6_2_) {
            __position._M_current = psVar13;
          }
        }
        else if (lVar11 == 2) {
LAB_0017aa08:
          peVar2 = (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          lrit::getHeader<lrit::SegmentIdentificationHeader>
                    ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
          __position._M_current = psVar15;
          if ((ushort)local_2e0._6_2_ <= local_4a0[0].frameStart.tv_sec._6_2_) {
            psVar15 = psVar15 + 1;
            goto LAB_0017aa33;
          }
        }
        else {
          __position._M_current = psVar13;
          if (lVar11 == 3) {
            peVar2 = (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            lrit::getHeader<lrit::SegmentIdentificationHeader>
                      ((SegmentIdentificationHeader *)local_2e0,&peVar2->header_,&peVar2->m_);
            __position._M_current = psVar15;
            if ((ushort)local_2e0._6_2_ <= local_4a0[0].frameStart.tv_sec._6_2_) {
              psVar15 = psVar15 + 1;
              goto LAB_0017aa08;
            }
          }
        }
LAB_0017aa73:
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::insert(this_01,__position,&local_510);
        if (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_510.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((long)(this_01->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_01->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)local_2f2.maxSegment) {
          Timer::Timer((Timer *)(local_4f8 + 0x20));
          psVar15 = (this_01->
                    super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          f_00 = (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          this_00 = (psVar15->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          std::
          vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
          ::vector(&local_420,this_01);
          Image::createFromFiles((Image *)local_518,&local_420);
          std::
          vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
          ::~vector(&local_420);
          std::
          vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
          ::clear(this_01);
          lrit::getHeader<lrit::AnnotationHeader>
                    ((AnnotationHeader *)local_2e0,&f_00->header_,&f_00->m_);
          if ((undefined1 *)local_2e0._8_8_ == local_2c8) {
            local_4f8._24_8_ = aStack_2c0._0_8_;
            local_4f8._0_8_ = local_4f8 + 0x10;
          }
          else {
            local_4f8._0_8_ = local_2e0._8_8_;
          }
          local_4f8._16_8_ = local_2c8;
          pGVar12 = (GOESNImageHandler *)local_4f8;
          removeSuffix(&local_440,(string *)pGVar12);
          loadDetails((Details *)local_328,pGVar12,f_00);
          local_290._M_p = (pointer)&local_280;
          local_2e0._0_8_ = local_2e0 + 0x10;
          local_2e0._8_8_ = (pointer)0x0;
          local_2e0[0x10] = '\0';
          aStack_2c0._M_allocated_capacity = (size_type)&local_2b0;
          aStack_2c0._8_8_ = (pointer)0x0;
          local_2b0._M_local_buf[0] = '\0';
          local_2a0 = 0;
          pMStack_298 = (pointer)0x0;
          local_288 = (pointer)0x0;
          local_280._M_local_buf[0] = '\0';
          local_270._M_p = (pointer)&local_260;
          local_268 = (pointer)0x0;
          local_260._M_local_buf[0] = '\0';
          local_250._M_p = (pointer)&local_240;
          local_248 = 0;
          local_240._M_local_buf[0] = '\0';
          local_230._M_p = (pointer)&local_220;
          local_228 = 0;
          local_220._M_local_buf[0] = '\0';
          local_210._M_p = (pointer)&local_200;
          local_208 = 0;
          local_200._M_local_buf[0] = '\0';
          local_1f0._M_p = (pointer)&local_1e0;
          local_1e8 = (_Base_ptr)0x0;
          local_1e0._M_local_buf[0] = '\0';
          local_1d0._M_p = (pointer)&local_1c0;
          local_1c8 = 0;
          local_1c0._M_local_buf[0] = _S_red;
          local_1b0._M_p = (pointer)&local_1a0;
          local_1a8 = (_Base_ptr)0x0;
          local_1a0._M_local_buf[0] = '\0';
          local_190._M_p = (pointer)&local_180;
          local_188 = 0;
          local_180._M_local_buf[0] = '\0';
          local_170._M_p = (pointer)&local_160;
          local_168 = 0;
          local_160._M_local_buf[0] = '\0';
          local_150._M_p = (pointer)&local_140;
          local_148 = 0;
          local_140._M_local_buf[0] = '\0';
          local_130._M_p = (pointer)&local_120;
          local_128 = 0;
          local_120._M_local_buf[0] = '\0';
          local_110._M_p = (pointer)&local_100;
          local_108 = (pointer)0x0;
          local_100._M_local_buf[0] = '\0';
          local_f0._M_allocated_capacity = (size_type)&local_e0;
          local_f0._8_8_ = 0;
          local_e0._M_local_buf[0] = '\0';
          local_d0._M_p = (pointer)&local_c0;
          local_c8 = (_Invoker_type)0x0;
          local_c0._M_local_buf[0] = '\0';
          local_b0._M_nxt = (_Hash_node_base *)&local_a0;
          local_a8 = 0;
          local_a0._M_local_buf[0] = '\0';
          std::__cxx11::string::_M_assign((string *)local_2e0);
          std::__cxx11::string::_M_assign((string *)(local_2c8 + 8));
          local_2a0 = local_328._0_8_;
          pMStack_298 = (pointer)local_328._8_8_;
          std::__cxx11::string::_M_assign((string *)&local_110);
          std::__cxx11::string::_M_assign((string *)local_f0._M_local_buf);
          std::__cxx11::string::_M_assign((string *)&local_d0);
          std::__cxx11::string::_M_assign((string *)&local_b0);
          cv::Mat::Mat((Mat *)local_4a0);
          if (((this->config_).crop.maxColumn == (this->config_).crop.minColumn) &&
             ((this->config_).crop.maxLine == (this->config_).crop.minLine)) {
            Image::getScaledImage((Image *)local_408,local_518[0]);
            cv::Mat::operator=((Mat *)local_4a0,(Mat *)local_408);
          }
          else {
            Image::getScaledImage((Image *)local_408,(Area *)local_518,(bool)((char)this + -0x2c));
            cv::Mat::operator=((Mat *)local_4a0,(Mat *)local_408);
          }
          cv::Mat::~Mat((Mat *)local_408);
          pcVar7 = (this->config_).format._M_dataplus._M_p;
          local_4c0._M_allocated_capacity = (size_type)&local_4b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c0,pcVar7,pcVar7 + (this->config_).format._M_string_length);
          FilenameBuilder::build
                    ((string *)local_408,(FilenameBuilder *)local_2e0,&(this->config_).filename,
                     (string *)&local_4c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._M_allocated_capacity != &local_4b0) {
            operator_delete((void *)local_4c0._M_allocated_capacity,
                            (ulong)(local_4b0._M_allocated_capacity + 1));
          }
          FileWriter::write((this->fileWriter_).
                            super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (int)local_408,local_4a0,(size_t)(local_4f8 + 0x20));
          if ((this->config_).json == true) {
            FileWriter::writeHeader
                      ((this->fileWriter_).
                       super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,f_00,
                       (string *)local_408);
          }
          if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
            operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
          }
          cv::Mat::~Mat((Mat *)local_4a0);
          FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_2e0);
          if ((pointer)local_328._16_8_ != (pointer)(local_328 + 0x20)) {
            operator_delete((void *)local_328._16_8_,(ulong)(local_328._32_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._M_dataplus._M_p != &local_440.field_2) {
            operator_delete(local_440._M_dataplus._M_p,local_440.field_2._0_8_ + 1);
          }
          if ((undefined1 *)local_4f8._0_8_ != local_4f8 + 0x10) {
            operator_delete((void *)local_4f8._0_8_,local_4f8._16_8_ + 1);
          }
          std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                    ((unique_ptr<Image,_std::default_delete<Image>_> *)local_518);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &local_90.
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(local_90.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_90.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .
               super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl._M_dataplus._M_p !=
            &local_90.
             super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .
             super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             ._M_head_impl.field_2) {
          operator_delete(local_90.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl._M_dataplus._M_p,
                          local_90.
                          super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .
                          super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                          ._M_head_impl.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.nameLong._M_dataplus._M_p != &local_3a8.nameLong.field_2) {
    operator_delete(local_3a8.nameLong._M_dataplus._M_p,
                    local_3a8.nameLong.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.nameShort._M_dataplus._M_p != &local_3a8.nameShort.field_2) {
    operator_delete(local_3a8.nameShort._M_dataplus._M_p,
                    local_3a8.nameShort.field_2._M_allocated_capacity + 1);
  }
LAB_0017afb6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.nameLong._M_dataplus._M_p != &local_368.nameLong.field_2) {
    operator_delete(local_368.nameLong._M_dataplus._M_p,
                    local_368.nameLong.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.nameShort._M_dataplus._M_p != &local_368.nameShort.field_2) {
    operator_delete(local_368.nameShort._M_dataplus._M_p,
                    local_368.nameShort.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GOESNImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter by product
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != productID_) {
    return;
  }

  // Filter by region
  auto region = loadRegion(nlh);
  if (!config_.regions.empty()) {
    auto begin = std::begin(config_.regions);
    auto end = std::end(config_.regions);
    auto it = std::find(begin, end, region.nameShort);
    if (it == end) {
      return;
    }
  }

  // Filter by channel
  auto channel = loadChannel(nlh);
  if (!config_.channels.empty()) {
    auto begin = std::begin(config_.channels);
    auto end = std::end(config_.channels);
    auto it = std::find(begin, end, channel.nameShort);
    if (it == end) {
      return;
    }
  }

  // Assume all images are segmented
  if (!f->hasHeader<lrit::SegmentIdentificationHeader>()) {
    return;
  }

  auto sih = f->getHeader<lrit::SegmentIdentificationHeader>();
  auto key = std::make_tuple("unused", region.nameShort, channel.nameShort);
  auto& vector = segments_[key];

  // Ensure we can append this segment
  if (!vector.empty()) {
    const auto& t = vector.front();

    // Use "Time of frame start" field in ancillary text header to
    // check that this segment belongs to the set of existing ones.
    // Previously this was done with the segment identification
    // header, but a ground station update in August 2018 introduced
    // an error where segments of the same image often don't share the
    // same image identification header. This is only the case for the
    // GOES-16 (possibly also GOES-17) relay of GOES-15 on HRIT.
    auto da = loadDetails(*f);
    auto db = loadDetails(*t);
    if (da.frameStart.tv_sec != db.frameStart.tv_sec) {
      vector.clear();
    }
  }

  insertSegment(vector, f);
  if (vector.size() == sih.maxSegment) {
    Timer t;

    auto first = vector.front();
    auto image = Image::createFromFiles(vector);
    vector.clear();

    auto text = first->getHeader<lrit::AnnotationHeader>().text;
    auto filename = removeSuffix(text);
    auto details = loadDetails(*first);

    FilenameBuilder fb;
    fb.dir = config_.dir;
    fb.filename = filename;
    fb.time = details.frameStart;
    fb.region = region;
    fb.channel = channel;

    cv::Mat raw;
    if (config_.crop.empty()) {
      raw = image->getScaledImage(false);
    } else {
      raw = image->getScaledImage(config_.crop, false);
    }

    overlayMaps(*first, config_.crop, raw);
    auto path = fb.build(config_.filename, config_.format);
    fileWriter_->write(path, raw, &t);
    if (config_.json) {
      fileWriter_->writeHeader(*first, path);
    }
    return;
  }
}